

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer>
             *this,char **it)

{
  long lVar1;
  long lVar2;
  size_t __n;
  long lVar3;
  char *__s;
  char *pcVar4;
  
  lVar1 = *(long *)(this + 0x10);
  __s = *it;
  if (lVar1 != 0) {
    lVar2 = *(long *)(this + 8);
    lVar3 = 0;
    do {
      __s[lVar3] = *(char *)(lVar2 + lVar3);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
    __s = __s + lVar3;
    *it = __s;
  }
  __n = *(size_t *)(this + 0x20);
  pcVar4 = __s;
  if (__n != 0) {
    pcVar4 = __s + __n;
    memset(__s,*(int *)(this + 0x18),__n);
  }
  *it = pcVar4;
  int_writer<unsigned__int128,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer::operator()
            ((dec_writer *)(this + 0x30),it);
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }